

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O2

ssize_t add_all_files(int fd,char *parent,char *rel,char *host)

{
  char cVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  ulong uVar4;
  size_t nbyte;
  char *pcVar5;
  long lVar6;
  stat st;
  char new_rel [256];
  undefined8 local_e38;
  undefined8 uStack_e30;
  uint local_e28 [2];
  size_t local_e20;
  SceDateTime local_e18;
  SceDateTime local_e08;
  SceDateTime local_df8;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  char local_dd0 [256];
  undefined4 local_cd0;
  char local_ccc [1160];
  undefined8 local_844;
  undefined4 local_83c;
  char new_host [1024];
  undefined8 local_430;
  undefined1 local_428 [1004];
  undefined8 local_3c;
  undefined4 local_34;
  
  __dirp = opendir(host);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",host);
  }
  else {
    lVar6 = 0;
    do {
      do {
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) {
          closedir(__dirp);
          return lVar6;
        }
        cVar1 = *rel;
      } while (((cVar1 == '\0') && (iVar2 = strcmp(pdVar3->d_name,"VITA_PATH.TXT"), iVar2 == 0)) ||
              ((pdVar3->d_name[0] == '.' &&
               ((pdVar3->d_name[1] == '\0' ||
                ((pdVar3->d_name[1] == '.' && (pdVar3->d_name[2] == '\0'))))))));
      pcVar5 = pdVar3->d_name;
      if ((cVar1 == '\0') && (iVar2 = strcmp(pcVar5,"VITA_DATA.BIN"), iVar2 == 0)) {
        new_rel[0] = '\0';
      }
      else {
        iVar2 = snprintf(new_rel,0x100,"%s/%s",rel,pcVar5);
        if (iVar2 == 0x100) {
          fprintf(_stderr,"path is too long! cannot add %s/%s\n",rel,pcVar5);
          break;
        }
      }
      snprintf(new_host,0x400,"%s/%s",host,pcVar5);
      memset(local_e28,0x78,0x5f0);
      local_e38 = 0;
      uStack_e30 = 0;
      iVar2 = stat(new_host,(stat *)&st);
      if (iVar2 < 0) {
        pcVar5 = "error getting stat for %s\n";
LAB_0010338e:
        fprintf(_stderr,pcVar5,new_host);
        break;
      }
      local_e28[0] = ((st.st_mode & 6) << 6 | st.st_mode & 0x30 | st.st_mode >> 6 & 6) +
                     (uint)((st.st_mode & 0xf000) != 0x4000) * 0x1000 + 0x1000;
      local_e28[1] = 0;
      local_e20 = st.st_size;
      time_to_scetime(&st.st_ctim.tv_sec,&local_e18);
      time_to_scetime(&st.st_atim.tv_sec,&local_e08);
      time_to_scetime(&st.st_mtim.tv_sec,&local_df8);
      local_de8 = 0;
      uStack_de0 = 0;
      local_dd8 = 0;
      strncpy(local_dd0,parent,0x100);
      local_cd0 = 1;
      strncpy(local_ccc,new_rel,0x100);
      local_844 = 0x616548664f646e45;
      local_83c = 0xa726564;
      write_block(fd,&local_e38,0x600);
      nbyte = local_e20;
      if ((local_e28[0] & 0xf000) == 0x2000) {
        printf("packing file %s%s (%llx bytes)...\n",local_dd0,local_ccc,local_e20);
        iVar2 = open(new_host,0);
        if (iVar2 < 0) {
          pcVar5 = "error opening %s\n";
          goto LAB_0010338e;
        }
        uVar4 = copy_block(fd,iVar2,nbyte);
        if (uVar4 < nbyte) {
          fwrite("error writing file data\n",0x18,1,_stderr);
          close(iVar2);
          break;
        }
        close(iVar2);
        iVar2 = 0x400 - ((uint)nbyte & 0x3ff);
        if ((nbyte & 0x3ff) == 0) {
          iVar2 = 0;
        }
      }
      else {
        nbyte = 0;
        iVar2 = 0;
      }
      while (0 < iVar2) {
        st.st_dev._0_1_ = 0x2b;
        if (iVar2 == 1) {
          st.st_dev._0_1_ = 10;
        }
        write_block(fd,&st,1);
        iVar2 = iVar2 + -1;
      }
      memset(local_428,0x7a,0x3ec);
      local_430 = 0;
      local_3c = 0x696154664f646e45;
      local_34 = 0xa72656c;
      write_block(fd,&local_430,0x400);
      if ((local_e28[0] & 0xf000) == 0x1000) {
        printf("packing directory %s%s...\n",local_dd0,local_ccc);
        nbyte = add_all_files(fd,parent,new_rel,new_host);
      }
      lVar6 = lVar6 + nbyte;
    } while (-1 < (long)nbyte);
    closedir(__dirp);
  }
  return -1;
}

Assistant:

static ssize_t add_all_files(int fd, const char *parent, const char *rel, const char *host) {
  char new_rel[256];
  char new_host[MAX_PATH_LEN];
  DIR *dir;
  struct dirent *dent;
  ssize_t fsize, total;

  if ((dir = opendir(host)) == NULL) {
    fprintf(stderr, "cannot open %s\n", host);
    return -1;
  }

  total = 0;
  while ((dent = readdir(dir)) != NULL) {
    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_PATH.TXT") == 0) {
      // skip this file
      continue;
    }

    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_DATA.BIN") == 0) { // special file
      new_rel[0] = '\0';
    } else {
      if (snprintf(new_rel, sizeof(new_rel), "%s/%s", rel, dent->d_name) == sizeof(new_rel)) {
        fprintf(stderr, "path is too long! cannot add %s/%s\n", rel, dent->d_name);
        goto err;
      }
    }
    snprintf(new_host, sizeof(new_host), "%s/%s", host, dent->d_name);

    dent = NULL; // so we don't actually reuse it
    // add file/directory to psvimg
    if ((fsize = add_file(fd, parent, new_rel, new_host)) < 0) {
      goto err;
    }
    total += fsize;
  }

  closedir(dir);
  return total;

err:
  closedir(dir);
  return -1;
}